

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O1

void drwav_u8_to_f32(float *pOut,drwav_uint8 *pIn,size_t sampleCount)

{
  size_t i;
  size_t sVar1;
  
  if (sampleCount != 0 && (pIn != (drwav_uint8 *)0x0 && pOut != (float *)0x0)) {
    sVar1 = 0;
    do {
      pOut[sVar1] = (float)pIn[sVar1] / 255.0 + (float)pIn[sVar1] / 255.0 + -1.0;
      sVar1 = sVar1 + 1;
    } while (sampleCount != sVar1);
  }
  return;
}

Assistant:

void drwav_u8_to_f32(float* pOut, const drwav_uint8* pIn, size_t sampleCount)
{
    if (pOut == NULL || pIn == NULL) {
        return;
    }

#ifdef DR_WAV_LIBSNDFILE_COMPAT
    // It appears libsndfile uses slightly different logic for the u8 -> f32 conversion to dr_wav, which in my opinion is incorrect. It appears
    // libsndfile performs the conversion something like "f32 = (u8 / 256) * 2 - 1", however I think it should be "f32 = (u8 / 255) * 2 - 1" (note
    // the divisor of 256 vs 255). I use libsndfile as a benchmark for testing, so I'm therefore leaving this block here just for my automated
    // correctness testing. This is disabled by default.
    for (size_t i = 0; i < sampleCount; ++i) {
        *pOut++ = (pIn[i] / 256.0f) * 2 - 1;
    }
#else
    for (size_t i = 0; i < sampleCount; ++i) {
        *pOut++ = (pIn[i] / 255.0f) * 2 - 1;
    }
#endif
}